

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::internal::LazyDescriptor::OnceInternal(LazyDescriptor *this)

{
  bool bVar1;
  LogMessage *other;
  Symbol SVar2;
  undefined1 local_70 [8];
  Symbol result;
  LogMessage local_48;
  LazyDescriptor *local_10;
  LazyDescriptor *this_local;
  
  local_10 = this;
  if (((byte)this->file_[0xb8] & 1) == 0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1ab9);
    other = LogMessage::operator<<(&local_48,"CHECK failed: file_->finished_building_: ");
    LogFinisher::operator=((LogFinisher *)((long)&result.field_1 + 3),other);
    LogMessage::~LogMessage(&local_48);
  }
  if ((this->descriptor_ == (Descriptor *)0x0) && (this->name_ != (string *)0x0)) {
    SVar2 = DescriptorPool::CrossLinkOnDemandHelper
                      (*(DescriptorPool **)(this->file_ + 0x10),this->name_,false);
    result._0_8_ = SVar2.field_1;
    local_70._0_4_ = SVar2.type;
    bVar1 = Symbol::IsNull((Symbol *)local_70);
    if ((!bVar1) && (local_70._0_4_ == MESSAGE)) {
      this->descriptor_ = (Descriptor *)result._0_8_;
    }
  }
  return;
}

Assistant:

void LazyDescriptor::OnceInternal() {
  GOOGLE_CHECK(file_->finished_building_);
  if (!descriptor_ && name_) {
    Symbol result = file_->pool_->CrossLinkOnDemandHelper(*name_, false);
    if (!result.IsNull() && result.type == Symbol::MESSAGE) {
      descriptor_ = result.descriptor;
    }
  }
}